

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

SubtableSymbol * WithBlock::getCurrentSubtable(list<WithBlock,_std::allocator<WithBlock>_> *stack)

{
  bool bVar1;
  reference pWVar2;
  _Self local_30;
  _List_node_base *local_28;
  _List_const_iterator<WithBlock> local_20;
  const_iterator iter;
  list<WithBlock,_std::allocator<WithBlock>_> *stack_local;
  
  iter._M_node = (_List_node_base *)stack;
  std::_List_const_iterator<WithBlock>::_List_const_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<WithBlock,_std::allocator<WithBlock>_>::begin(iter._M_node);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<WithBlock,_std::allocator<WithBlock>_>::end(iter._M_node);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) {
      return (SubtableSymbol *)0x0;
    }
    pWVar2 = std::_List_const_iterator<WithBlock>::operator*(&local_20);
    if (pWVar2->ss != (SubtableSymbol *)0x0) break;
    std::_List_const_iterator<WithBlock>::operator++(&local_20);
  }
  pWVar2 = std::_List_const_iterator<WithBlock>::operator*(&local_20);
  return pWVar2->ss;
}

Assistant:

SubtableSymbol *WithBlock::getCurrentSubtable(const list<WithBlock> &stack)

{
  list<WithBlock>::const_iterator iter;
  for(iter=stack.begin();iter!=stack.end();++iter) {
    if ((*iter).ss != (SubtableSymbol *)0)
      return (*iter).ss;
  }
  return (SubtableSymbol *)0;
}